

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O1

bool __thiscall
duckdb::
QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<double,_double,_double>,_duckdb::QuantileIndirect<double>_>_>
::operator()(QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<double,_double,_double>,_duckdb::QuantileIndirect<double>_>_>
             *this,INPUT_TYPE *lhs,INPUT_TYPE *rhs)

{
  DataChunk *pDVar1;
  double dVar2;
  double dVar3;
  MadAccessor<double,_double,_double> *pMVar4;
  CURSOR *pCVar5;
  ulong uVar6;
  bool bVar7;
  reference pvVar8;
  
  pMVar4 = this->accessor_l->outer;
  pCVar5 = this->accessor_l->inner->data;
  uVar6 = *lhs;
  if (((pCVar5->scan).next_row_index <= uVar6) || (uVar6 < (pCVar5->scan).current_row_index)) {
    pDVar1 = &pCVar5->page;
    ColumnDataCollection::Seek(pCVar5->inputs,uVar6,&pCVar5->scan,pDVar1);
    pvVar8 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,0);
    pCVar5->data = (double *)pvVar8->data;
    pvVar8 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,0);
    FlatVector::VerifyFlatVector(pvVar8);
    pCVar5->validity = &pvVar8->validity;
  }
  dVar2 = pCVar5->data[(uint)((int)uVar6 - (int)(pCVar5->scan).current_row_index)];
  dVar3 = *pMVar4->median;
  pMVar4 = this->accessor_r->outer;
  pCVar5 = this->accessor_r->inner->data;
  uVar6 = *rhs;
  if (((pCVar5->scan).next_row_index <= uVar6) || (uVar6 < (pCVar5->scan).current_row_index)) {
    pDVar1 = &pCVar5->page;
    ColumnDataCollection::Seek(pCVar5->inputs,uVar6,&pCVar5->scan,pDVar1);
    pvVar8 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,0);
    pCVar5->data = (double *)pvVar8->data;
    pvVar8 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,0);
    FlatVector::VerifyFlatVector(pvVar8);
    pCVar5->validity = &pvVar8->validity;
  }
  dVar2 = ABS(dVar2 - dVar3);
  dVar3 = ABS(pCVar5->data[(uint)((int)uVar6 - (int)(pCVar5->scan).current_row_index)] -
              *pMVar4->median);
  bVar7 = dVar2 < dVar3;
  if (this->desc != false) {
    bVar7 = dVar3 < dVar2;
  }
  return bVar7;
}

Assistant:

inline bool operator()(const INPUT_TYPE &lhs, const INPUT_TYPE &rhs) const {
		const auto lval = accessor_l(lhs);
		const auto rval = accessor_r(rhs);

		return desc ? (rval < lval) : (lval < rval);
	}